

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

LY_ERR xpath_re_match(lyxp_set **args,uint32_t UNUSED_arg_count,lyxp_set *set,uint32_t options)

{
  ly_ctx *plVar1;
  lysc_pattern **patterns_00;
  ly_bool lVar2;
  char *pcVar3;
  void *pvVar4;
  size_t str_len;
  long *local_68;
  char *p__;
  LY_ERR ret___1;
  LY_ERR ret__;
  ly_err_item *err;
  lysc_node *plStack_48;
  LY_ERR rc;
  lysc_node_leaf *sleaf;
  lysc_pattern **pattern;
  lysc_pattern **patterns;
  lyxp_set *plStack_28;
  uint32_t options_local;
  lyxp_set *set_local;
  lyxp_set **pplStack_18;
  uint32_t UNUSED_arg_count_local;
  lyxp_set **args_local;
  
  pattern = (lysc_pattern **)0x0;
  err._4_4_ = LY_SUCCESS;
  patterns._4_4_ = options;
  plStack_28 = set;
  set_local._4_4_ = UNUSED_arg_count;
  pplStack_18 = args;
  if ((options & 0x1c) == 0) {
    err._4_4_ = lyxp_set_cast(*args,LYXP_SET_STRING);
    args_local._4_4_ = err._4_4_;
    if ((err._4_4_ == LY_SUCCESS) &&
       (err._4_4_ = lyxp_set_cast(pplStack_18[1],LYXP_SET_STRING), args_local._4_4_ = err._4_4_,
       err._4_4_ == LY_SUCCESS)) {
      if (pattern == (lysc_pattern **)0x0) {
        local_68 = (long *)malloc(0x10);
        if (local_68 == (long *)0x0) {
          ly_log(plStack_28->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                 "xpath_re_match");
          return LY_EMEM;
        }
        *local_68 = 1;
      }
      else {
        pattern[-1] = (lysc_pattern *)((long)&pattern[-1]->expr + 1);
        local_68 = (long *)realloc(pattern + -1,(long)pattern[-1] * 8 + 8);
        if (local_68 == (long *)0x0) {
          pattern[-1] = (lysc_pattern *)&pattern[-1][-1].field_0x3f;
          ly_log(plStack_28->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                 "xpath_re_match");
          return LY_EMEM;
        }
      }
      pattern = (lysc_pattern **)(local_68 + 1);
      sleaf = (lysc_node_leaf *)(pattern + *local_68 + -1);
      memset(sleaf,0,8);
      pvVar4 = calloc(1,0x40);
      *(void **)&sleaf->field_0 = pvVar4;
      if ((plStack_28->field_10).cur_node != (lyd_node *)0x0) {
        ly_log_location((lysc_node *)0x0,(plStack_28->field_10).cur_node,(char *)0x0,(ly_in *)0x0);
      }
      err._4_4_ = lys_compile_type_pattern_check
                            (plStack_28->ctx,(pplStack_18[1]->val).str,
                             (pcre2_code_8 **)(*(long *)&sleaf->field_0 + 8));
      if ((plStack_28->field_10).cur_node != (lyd_node *)0x0) {
        ly_log_location_revert(0,1,0,0);
      }
      patterns_00 = pattern;
      if (err._4_4_ == LY_SUCCESS) {
        pcVar3 = ((*pplStack_18)->val).str;
        str_len = strlen(((*pplStack_18)->val).str);
        err._4_4_ = lyplg_type_validate_patterns
                              (patterns_00,pcVar3,str_len,(ly_err_item **)&ret___1);
        pcre2_code_free_8(*(undefined8 *)(*(long *)&sleaf->field_0 + 8));
        free(*(void **)&sleaf->field_0);
        if (pattern != (lysc_pattern **)0x0) {
          free(pattern + -1);
        }
        if ((err._4_4_ == LY_SUCCESS) || (err._4_4_ == LY_EVALID)) {
          if (err._4_4_ == LY_EVALID) {
            ly_err_free(_ret___1);
            set_fill_boolean(plStack_28,'\0');
          }
          else {
            set_fill_boolean(plStack_28,'\x01');
          }
          args_local._4_4_ = LY_SUCCESS;
        }
        else {
          ly_err_print(plStack_28->ctx,_ret___1);
          ly_err_free(_ret___1);
          args_local._4_4_ = err._4_4_;
        }
      }
      else {
        if (pattern != (lysc_pattern **)0x0) {
          free(pattern + -1);
        }
        args_local._4_4_ = err._4_4_;
      }
    }
  }
  else {
    if (((*args)->type == LYXP_SET_SCNODE_SET) &&
       (plStack_48 = warn_get_scnode_in_ctx(*args), plStack_48 != (lysc_node *)0x0)) {
      if ((plStack_48->nodetype & 0xc) == 0) {
        plVar1 = plStack_28->ctx;
        pcVar3 = lys_nodetype2str(plStack_48->nodetype);
        ly_log(plVar1,LY_LLWRN,LY_SUCCESS,"Argument #1 of %s is a %s node \"%s\".","xpath_re_match",
               pcVar3,plStack_48->name);
      }
      else {
        lVar2 = warn_is_string_type((lysc_type *)plStack_48[1].parent);
        if (lVar2 == '\0') {
          ly_log(plStack_28->ctx,LY_LLWRN,LY_SUCCESS,
                 "Argument #1 of %s is node \"%s\", not of string-type.","xpath_re_match",
                 plStack_48->name);
        }
      }
    }
    if ((pplStack_18[1]->type == LYXP_SET_SCNODE_SET) &&
       (plStack_48 = warn_get_scnode_in_ctx(pplStack_18[1]), plStack_48 != (lysc_node *)0x0)) {
      if ((plStack_48->nodetype & 0xc) == 0) {
        plVar1 = plStack_28->ctx;
        pcVar3 = lys_nodetype2str(plStack_48->nodetype);
        ly_log(plVar1,LY_LLWRN,LY_SUCCESS,"Argument #2 of %s is a %s node \"%s\".","xpath_re_match",
               pcVar3,plStack_48->name);
      }
      else {
        lVar2 = warn_is_string_type((lysc_type *)plStack_48[1].parent);
        if (lVar2 == '\0') {
          ly_log(plStack_28->ctx,LY_LLWRN,LY_SUCCESS,
                 "Argument #2 of %s is node \"%s\", not of string-type.","xpath_re_match",
                 plStack_48->name);
        }
      }
    }
    set_scnode_clear_ctx(plStack_28,1);
    args_local._4_4_ = err._4_4_;
  }
  return args_local._4_4_;
}

Assistant:

static LY_ERR
xpath_re_match(struct lyxp_set **args, uint32_t UNUSED(arg_count), struct lyxp_set *set, uint32_t options)
{
    struct lysc_pattern **patterns = NULL, **pattern;
    struct lysc_node_leaf *sleaf;
    LY_ERR rc = LY_SUCCESS;
    struct ly_err_item *err;

    if (options & LYXP_SCNODE_ALL) {
        if ((args[0]->type == LYXP_SET_SCNODE_SET) && (sleaf = (struct lysc_node_leaf *)warn_get_scnode_in_ctx(args[0]))) {
            if (!(sleaf->nodetype & (LYS_LEAF | LYS_LEAFLIST))) {
                LOGWRN(set->ctx, "Argument #1 of %s is a %s node \"%s\".", __func__, lys_nodetype2str(sleaf->nodetype), sleaf->name);
            } else if (!warn_is_string_type(sleaf->type)) {
                LOGWRN(set->ctx, "Argument #1 of %s is node \"%s\", not of string-type.", __func__, sleaf->name);
            }
        }

        if ((args[1]->type == LYXP_SET_SCNODE_SET) && (sleaf = (struct lysc_node_leaf *)warn_get_scnode_in_ctx(args[1]))) {
            if (!(sleaf->nodetype & (LYS_LEAF | LYS_LEAFLIST))) {
                LOGWRN(set->ctx, "Argument #2 of %s is a %s node \"%s\".", __func__, lys_nodetype2str(sleaf->nodetype), sleaf->name);
            } else if (!warn_is_string_type(sleaf->type)) {
                LOGWRN(set->ctx, "Argument #2 of %s is node \"%s\", not of string-type.", __func__, sleaf->name);
            }
        }
        set_scnode_clear_ctx(set, LYXP_SET_SCNODE_ATOM_VAL);
        return rc;
    }

    rc = lyxp_set_cast(args[0], LYXP_SET_STRING);
    LY_CHECK_RET(rc);
    rc = lyxp_set_cast(args[1], LYXP_SET_STRING);
    LY_CHECK_RET(rc);

    LY_ARRAY_NEW_RET(set->ctx, patterns, pattern, LY_EMEM);
    *pattern = calloc(1, sizeof **pattern);
    if (set->cur_node) {
        LOG_LOCSET(NULL, set->cur_node);
    }
    rc = lys_compile_type_pattern_check(set->ctx, args[1]->val.str, &(*pattern)->code);
    if (set->cur_node) {
        LOG_LOCBACK(0, 1);
    }
    if (rc != LY_SUCCESS) {
        LY_ARRAY_FREE(patterns);
        return rc;
    }

    rc = lyplg_type_validate_patterns(patterns, args[0]->val.str, strlen(args[0]->val.str), &err);
    pcre2_code_free((*pattern)->code);
    free(*pattern);
    LY_ARRAY_FREE(patterns);
    if (rc && (rc != LY_EVALID)) {
        ly_err_print(set->ctx, err);
        ly_err_free(err);
        return rc;
    }

    if (rc == LY_EVALID) {
        ly_err_free(err);
        set_fill_boolean(set, 0);
    } else {
        set_fill_boolean(set, 1);
    }

    return LY_SUCCESS;
}